

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall google::protobuf::MessageLite::AppendToString(MessageLite *this,Cord *output)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  MessageLite *in_R8;
  string_view action;
  LogMessage LStack_48;
  string local_38;
  
  iVar4 = (*this->_vptr_MessageLite[4])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar4) + 0x18);
  if (pcVar1 == (code *)0x0) {
    cVar2 = '\x01';
  }
  else {
    cVar2 = (*pcVar1)(this);
  }
  if (cVar2 != '\0') {
    bVar3 = AppendPartialToString(this,output);
    return bVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0x28b,"IsInitialized()");
  action._M_str = (char *)this;
  action._M_len = (size_t)"serialize";
  (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)0x9,action,in_R8);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_48)
  ;
}

Assistant:

bool MessageLite::AppendToString(absl::Cord* output) const {
  ABSL_DCHECK(IsInitialized())
      << InitializationErrorMessage("serialize", *this);
  return AppendPartialToString(output);
}